

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# load.c
# Opt level: O0

int string_get(void *data)

{
  byte bVar1;
  string_data_t *stream;
  char c;
  void *data_local;
  
  bVar1 = *(byte *)(*data + *(long *)((long)data + 8));
  if (bVar1 == 0) {
    data_local._4_4_ = 0xffffffff;
  }
  else {
    *(long *)((long)data + 8) = *(long *)((long)data + 8) + 1;
    data_local._4_4_ = (uint)bVar1;
  }
  return data_local._4_4_;
}

Assistant:

static int string_get(void *data) {
    char c;
    string_data_t *stream = (string_data_t *) data;
    c = stream->data[stream->pos];
    if (c == '\0')
        return EOF;
    else {
        stream->pos++;
        return (unsigned char) c;
    }
}